

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void receive_wkr(VIface *iface)

{
  initializer_list<viface::VIface_*> __l;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_e0;
  _Invoker_type *local_c0;
  code *local_b8;
  undefined8 local_b0;
  type local_a8;
  undefined1 local_90 [8];
  dispatcher_cb mycb;
  MyDispatcher printer;
  allocator<viface::VIface_*> local_5a;
  less<viface::VIface_*> local_59;
  VIface *local_58;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_> ifaces;
  VIface *iface_local;
  
  local_50 = &local_58;
  local_48 = 1;
  local_58 = iface;
  ifaces._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)iface;
  std::allocator<viface::VIface_*>::allocator(&local_5a);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>::set
            ((set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
              *)local_40,__l,&local_59,&local_5a);
  std::allocator<viface::VIface_*>::~allocator(&local_5a);
  MyDispatcher::MyDispatcher((MyDispatcher *)&mycb._M_invoker);
  local_b8 = MyDispatcher::handler;
  local_b0 = 0;
  local_c0 = &mycb._M_invoker;
  std::
  bind<bool(MyDispatcher::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&),MyDispatcher*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_a8,(offset_in_MyDispatcher_to_subr *)&local_b8,(MyDispatcher **)&local_c0,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::
  function<bool(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>
  ::
  function<std::_Bind<bool(MyDispatcher::*(MyDispatcher*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>,void>
            ((function<bool(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>
              *)local_90,&local_a8);
  while (quit == 0) {
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::function(&local_e0,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)local_90);
    viface::dispatch(local_40,&local_e0,1000);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_e0);
  }
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
               *)local_90);
  std::set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>::~set
            ((set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
              *)local_40);
  return;
}

Assistant:

void receive_wkr(viface::VIface* iface)
{
    set<viface::VIface*> ifaces = {iface};
    MyDispatcher printer;
    viface::dispatcher_cb mycb = bind(
        &MyDispatcher::handler,
        &printer,
        placeholders::_1,
        placeholders::_2,
        placeholders::_3
        );

    while (!quit) {
        // We configure a dispatcher with a timeout of 1 second
        viface::dispatch(ifaces, mycb, 1000);
    }
}